

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
TwoValuesWithHashCollision_LevelOneCollisionUpsertIterator_Test::
TwoValuesWithHashCollision_LevelOneCollisionUpsertIterator_Test
          (TwoValuesWithHashCollision_LevelOneCollisionUpsertIterator_Test *this)

{
  TwoValuesWithHashCollision_LevelOneCollisionUpsertIterator_Test *this_local;
  
  anon_unknown.dwarf_10ddcf::TwoValuesWithHashCollision::TwoValuesWithHashCollision
            (&this->super_TwoValuesWithHashCollision);
  (this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.super_Test.
  _vptr_Test = (_func_int **)
               &PTR__TwoValuesWithHashCollision_LevelOneCollisionUpsertIterator_Test_003d0a50;
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LevelOneCollisionUpsertIterator) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "a");

    // Check trie iterator in the heap.
    EXPECT_TRUE (itp.second);
    test_trie::iterator begin = itp.first;
    test_trie::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);

    std::string const & v1 = (*begin).first;
    EXPECT_EQ ("a", v1);
    ++begin;
    std::string const & v2 = (*begin).first;
    EXPECT_EQ ("b", v2);
    ++begin;
    std::string const & v3 = (*begin).first;
    EXPECT_EQ ("c", v3);
    ++begin;
    EXPECT_EQ (begin, end);

    index_->flush (t1, db_.get_current_revision ());

    // Check trie iterator in the store.
    itp = this->insert_or_assign (*index_, t1, "a");
    EXPECT_FALSE (itp.second);
    // Check trie iterator in the heap.
    begin = itp.first;
    EXPECT_NE (begin, end);

    std::string const v5 = begin->first;
    EXPECT_EQ ("a", v5);
    ++begin;
    std::string const v6 = begin->first;
    EXPECT_EQ ("b", v6);
    ++begin;
    std::string const v7 = begin->first;
    EXPECT_EQ ("c", v7);
    ++begin;
    EXPECT_EQ (begin, end);
}